

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov4.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  char *__haystack;
  double dVar2;
  double dVar3;
  int iVar4;
  pointer pOVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  __m128 t_2;
  __m128 t;
  undefined1 local_358 [8];
  undefined8 uStack_350;
  Size local_348;
  undefined8 uStack_340;
  int baseLine;
  vector<Object,_std::allocator<Object>_> objects;
  Size label_size;
  float mean_vals [3];
  float norm_vals [3];
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  Extractor ex;
  Mat image;
  undefined4 local_268;
  undefined4 uStack_264;
  int iStack_260;
  Allocator *local_258;
  int iStack_250;
  int iStack_24c;
  int local_248;
  undefined8 uStack_244;
  size_t local_238;
  VideoCapture cap;
  Mat frame;
  int local_1e0;
  int local_1dc;
  uchar *local_1d8;
  char text [256];
  Net yolov4;
  
  cv::Mat::Mat(&frame);
  objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cv::VideoCapture::VideoCapture(&cap);
  ncnn::Net::Net(&yolov4);
  if (argc < 2) {
    main_cold_2();
  }
  else {
    __haystack = argv[1];
    dVar2 = ncnn::get_current_time();
    yolov4.opt.num_threads = 4;
    yolov4.opt.use_vulkan_compute = true;
    yolov4.opt.use_winograd_convolution = true;
    yolov4.opt.use_sgemm_convolution = true;
    yolov4.opt.use_fp16_packed = true;
    yolov4.opt.use_fp16_storage = true;
    yolov4.opt.use_fp16_arithmetic = true;
    yolov4.opt.use_packing_layout = true;
    yolov4.opt.use_shader_pack8 = false;
    yolov4.opt.use_image_storage = false;
    uVar7 = ncnn::Net::load_param(&yolov4,"yolov4-tiny-opt.param");
    if ((uVar7 == 0) && (uVar7 = ncnn::Net::load_model(&yolov4,"yolov4-tiny-opt.bin"), uVar7 == 0))
    {
      dVar3 = ncnn::get_current_time();
      fprintf(_stdout,"NCNN Init time %.02lfms\n",SUB84(dVar3 - dVar2,0));
      pcVar9 = strstr(__haystack,"/dev/video");
      if (pcVar9 == (char *)0x0) {
        std::__cxx11::string::string((string *)&image,argv[1],(allocator *)local_358);
        cv::imread((string *)text,(int)&image);
        cv::Mat::operator=(&frame,(Mat *)text);
        cv::Mat::~Mat((Mat *)text);
        if (_image != &local_268) {
          operator_delete(_image);
        }
        cVar6 = cv::Mat::empty();
        if (cVar6 == '\0') goto LAB_0013c24a;
        main_cold_1();
      }
      else {
        std::__cxx11::string::string((string *)text,__haystack,(allocator *)&image);
        cv::VideoCapture::open((string *)&cap,(int)text);
        if ((char *)text._0_8_ != text + 0x10) {
          operator_delete((void *)text._0_8_);
        }
        cVar6 = cv::VideoCapture::isOpened();
        if (cVar6 == '\0') {
          pcVar9 = "Failed to open %s";
        }
        else {
          cv::VideoCapture::operator>>(&cap,&frame);
          cVar6 = cv::Mat::empty();
          if (cVar6 == '\0') {
            do {
              dVar2 = ncnn::get_current_time();
              cv::VideoCapture::operator>>(&cap,&frame);
              dVar3 = ncnn::get_current_time();
              fprintf(_stdout,"NCNN OpenCV capture time %.02lfms\n",SUB84(dVar3 - dVar2,0));
              cVar6 = cv::Mat::empty();
              if (cVar6 != '\0') {
                pcVar9 = "OpenCV Failed to Capture from device %s\n";
                goto LAB_0013c1ec;
              }
LAB_0013c24a:
              dVar2 = ncnn::get_current_time();
              ncnn::Mat::from_pixels_resize
                        ((Mat *)text,local_1d8,0x10002,local_1dc,local_1e0,0x1a0,0x1a0,
                         (Allocator *)0x0);
              stack0xfffffffffffffd10 = (Mat *)((ulong)stack0xfffffffffffffd10 & 0xffffffff00000000)
              ;
              mean_vals[0] = 0.0;
              mean_vals[1] = 0.0;
              norm_vals[0] = 0.003921569;
              norm_vals[1] = 0.003921569;
              norm_vals[2] = 0.003921569;
              ncnn::Mat::substract_mean_normalize((Mat *)text,mean_vals,norm_vals);
              ncnn::Net::create_extractor((Net *)&ex);
              ncnn::Extractor::input(&ex,"data",(Mat *)text);
              local_238 = 0;
              _image = (undefined4 *)0x0;
              local_268 = 0;
              uStack_264 = 0;
              iStack_260 = 0;
              local_258 = (Allocator *)0x0;
              iStack_250 = 0;
              iStack_24c = 0;
              local_248 = 0;
              uStack_244._0_4_ = 0;
              uStack_244._4_4_ = 0;
              ncnn::Extractor::extract(&ex,"output",(Mat *)&image,0);
              if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                     super__Vector_impl_data._M_start;
              }
              if (0 < local_248) {
                lVar13 = 0;
                do {
                  lVar11 = iStack_24c * lVar13 * CONCAT44(uStack_264,local_268);
                  local_348.height = (int)*(float *)((long)_image + lVar11 + 4);
                  local_348.width = (int)*(float *)((long)_image + lVar11);
                  local_358._0_4_ = *(float *)((long)_image + lVar11 + 8) * (float)local_1dc;
                  local_358._4_4_ = *(float *)((long)_image + lVar11 + 0xc) * (float)local_1e0;
                  uStack_350 = (Mat *)CONCAT44(*(float *)((long)_image + lVar11 + 0x14) *
                                               (float)local_1e0 - (float)local_358._4_4_,
                                               *(float *)((long)_image + lVar11 + 0x10) *
                                               (float)local_1dc - (float)local_358._0_4_);
                  std::vector<Object,_std::allocator<Object>_>::push_back
                            (&objects,(value_type *)local_358);
                  lVar13 = lVar13 + 1;
                } while (lVar13 < local_248);
              }
              ncnn::Extractor::~Extractor(&ex);
              if (text._8_8_ != 0) {
                LOCK();
                *(int *)text._8_8_ = *(int *)text._8_8_ + -1;
                UNLOCK();
                if (*(int *)text._8_8_ == 0) {
                  if (text._32_8_ == 0) {
                    if (text._0_8_ != 0) {
                      free((void *)text._0_8_);
                    }
                  }
                  else {
                    (**(code **)(*(long *)text._32_8_ + 0x18))();
                  }
                }
              }
              dVar3 = ncnn::get_current_time();
              fprintf(_stdout,"NCNN detection time %.02lfms\n",SUB84(dVar3 - dVar2,0));
              dVar2 = ncnn::get_current_time();
              cv::Mat::clone();
              if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                lVar13 = 0;
                uVar14 = 0;
                do {
                  pOVar5 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                          SUB84((double)*(float *)((long)&(objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->prob +
                                                  lVar13),0),
                          (double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                  x + lVar13),
                          (double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                  y + lVar13),
                          (double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                  width + lVar13),
                          (double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                  height + lVar13),
                          (ulong)*(uint *)((long)&(objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->label
                                          + lVar13));
                  local_348.width = 0;
                  local_348.height = 0;
                  local_358._0_4_ = 3.7909693e-37;
                  auVar1 = *(undefined1 (*) [16])((long)&(pOVar5->rect).x + lVar13);
                  norm_vals[2] = (float)(int)ROUND(auVar1._8_4_);
                  norm_vals[1] = (float)(int)ROUND(auVar1._4_4_);
                  norm_vals[0] = (float)(int)ROUND(auVar1._0_4_);
                  text[0] = '\0';
                  text[1] = '\0';
                  text[2] = '\0';
                  text[3] = '\0';
                  text[4] = '\0';
                  text[5] = -0x20;
                  text[6] = 'o';
                  text[7] = '@';
                  text[0x18] = '\0';
                  text[0x19] = '\0';
                  text[0x1a] = '\0';
                  text[0x1b] = '\0';
                  text[0x1c] = '\0';
                  text[0x1d] = '\0';
                  text[0x1e] = '\0';
                  text[0x1f] = '\0';
                  text[8] = '\0';
                  text[9] = '\0';
                  text[10] = '\0';
                  text[0xb] = '\0';
                  text[0xc] = '\0';
                  text[0xd] = '\0';
                  text[0xe] = '\0';
                  text[0xf] = '\0';
                  text[0x10] = '\0';
                  text[0x11] = '\0';
                  text[0x12] = '\0';
                  text[0x13] = '\0';
                  text[0x14] = '\0';
                  text[0x15] = '\0';
                  text[0x16] = '\0';
                  text[0x17] = '\0';
                  uStack_350 = &image;
                  cv::rectangle((string *)local_358,norm_vals,text,1,8,0);
                  sprintf(text,"%s %.1f%%",
                          SUB84((double)(*(float *)((long)&pOVar5->prob + lVar13) * 100.0),0),
                          _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEiE11class_names_rel
                          + *(int *)(
                                    _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEiE11class_names_rel
                                    + (long)*(int *)((long)&pOVar5->label + lVar13) * 4));
                  baseLine = 0;
                  local_358 = (undefined1  [8])&local_348;
                  sVar10 = strlen(text);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_358,text,text + sVar10);
                  cv::getTextSize((string *)&label_size,(int)(string *)local_358,0.5,0,(int *)0x1);
                  if (local_358 != (undefined1  [8])&local_348) {
                    operator_delete((void *)local_358);
                  }
                  iVar8 = (int)*(float *)((long)&(pOVar5->rect).x + lVar13);
                  iVar12 = (int)((*(float *)((long)&(pOVar5->rect).y + lVar13) -
                                 (float)label_size.height) - (float)baseLine);
                  if (iVar12 < 1) {
                    iVar12 = 0;
                  }
                  iVar4 = -label_size.width;
                  if (label_size.width + iVar8 < 1) {
                    iVar4 = iVar8;
                  }
                  mean_vals[0] = 3.7909693e-37;
                  local_2bc = baseLine + label_size.height;
                  local_2c0 = label_size.width;
                  local_358 = (undefined1  [8])0x406fe00000000000;
                  uStack_350 = (Mat *)0x406fe00000000000;
                  local_348.width = 0;
                  local_348.height = 0x406fe000;
                  uStack_340 = 0;
                  unique0x10000f00 = &image;
                  local_2c8 = iVar4;
                  local_2c4 = iVar12;
                  cv::rectangle(mean_vals,&local_2c8,(string *)local_358,0xffffffff,8,0);
                  mean_vals[0] = 3.7909693e-37;
                  local_358 = (undefined1  [8])&local_348;
                  unique0x10000f08 = &image;
                  sVar10 = strlen(text);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_358,text,text + sVar10);
                  local_2cc = iVar12 + label_size.height;
                  ex._vptr_Extractor = (_func_int **)0x0;
                  ex.d = (ExtractorPrivate *)0x0;
                  local_2d0 = iVar4;
                  cv::putText(0,mean_vals,(string *)local_358,&local_2d0,0,&ex,1,8,0);
                  if (local_358 != (undefined1  [8])&local_348) {
                    operator_delete((void *)local_358);
                  }
                  uVar14 = uVar14 + 1;
                  lVar13 = lVar13 + 0x18;
                } while (uVar14 < (ulong)(((long)objects.
                                                 super__Vector_base<Object,_std::allocator<Object>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)objects.
                                                 super__Vector_base<Object,_std::allocator<Object>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                         -0x5555555555555555));
              }
              uStack_350 = &image;
              builtin_strncpy(text + 0x10,"image",6);
              text[8] = '\x05';
              text[9] = '\0';
              text[10] = '\0';
              text[0xb] = '\0';
              text[0xc] = '\0';
              text[0xd] = '\0';
              text[0xe] = '\0';
              text[0xf] = '\0';
              local_348.width = 0;
              local_348.height = 0;
              local_358._0_4_ = 0x1010000;
              text._0_8_ = text + 0x10;
              cv::imshow((string *)text,(_InputArray *)local_358);
              if ((char *)text._0_8_ != text + 0x10) {
                operator_delete((void *)text._0_8_);
              }
              cv::waitKey((uint)(pcVar9 != (char *)0x0));
              cv::Mat::~Mat(&image);
              dVar3 = ncnn::get_current_time();
              fprintf(_stdout,"NCNN OpenCV draw result time %.02lfms\n",SUB84(dVar3 - dVar2,0));
            } while (pcVar9 != (char *)0x0);
            iVar12 = 0;
            goto LAB_0013c1a2;
          }
          pcVar9 = "Failed to read from device %s.\n";
        }
LAB_0013c1ec:
        fprintf(_stderr,pcVar9,__haystack);
      }
    }
    else {
      fprintf(_stderr,"Failed to load model or param, error %d",(ulong)uVar7);
    }
  }
  iVar12 = -1;
LAB_0013c1a2:
  ncnn::Net::~Net(&yolov4);
  cv::VideoCapture::~VideoCapture(&cap);
  if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat(&frame);
  return iVar12;
}

Assistant:

int main(int argc, char** argv)
{
    cv::Mat frame;
    std::vector<Object> objects;

    cv::VideoCapture cap;

    ncnn::Net yolov4;

    const char* devicepath;

    int target_size = 0;
    int is_streaming = 0;

    if (argc < 2)
    {
        fprintf(stderr, "Usage: %s [v4l input device or image]\n", argv[0]);
        return -1;
    }

    devicepath = argv[1];

#ifdef NCNN_PROFILING
    double t_load_start = ncnn::get_current_time();
#endif

    int ret = init_yolov4(&yolov4, &target_size); //We load model and param first!
    if (ret != 0)
    {
        fprintf(stderr, "Failed to load model or param, error %d", ret);
        return -1;
    }

#ifdef NCNN_PROFILING
    double t_load_end = ncnn::get_current_time();
    fprintf(stdout, "NCNN Init time %.02lfms\n", t_load_end - t_load_start);
#endif

    if (strstr(devicepath, "/dev/video") == NULL)
    {
        frame = cv::imread(argv[1], 1);
        if (frame.empty())
        {
            fprintf(stderr, "Failed to read image %s.\n", argv[1]);
            return -1;
        }
    }
    else
    {
        cap.open(devicepath);

        if (!cap.isOpened())
        {
            fprintf(stderr, "Failed to open %s", devicepath);
            return -1;
        }

        cap >> frame;

        if (frame.empty())
        {
            fprintf(stderr, "Failed to read from device %s.\n", devicepath);
            return -1;
        }

        is_streaming = 1;
    }

    while (1)
    {
        if (is_streaming)
        {
#ifdef NCNN_PROFILING
            double t_capture_start = ncnn::get_current_time();
#endif

            cap >> frame;

#ifdef NCNN_PROFILING
            double t_capture_end = ncnn::get_current_time();
            fprintf(stdout, "NCNN OpenCV capture time %.02lfms\n", t_capture_end - t_capture_start);
#endif
            if (frame.empty())
            {
                fprintf(stderr, "OpenCV Failed to Capture from device %s\n", devicepath);
                return -1;
            }
        }

#ifdef NCNN_PROFILING
        double t_detect_start = ncnn::get_current_time();
#endif

        detect_yolov4(frame, objects, target_size, &yolov4); //Create an extractor and run detection

#ifdef NCNN_PROFILING
        double t_detect_end = ncnn::get_current_time();
        fprintf(stdout, "NCNN detection time %.02lfms\n", t_detect_end - t_detect_start);
#endif

#ifdef NCNN_PROFILING
        double t_draw_start = ncnn::get_current_time();
#endif

        draw_objects(frame, objects, is_streaming); //Draw detection results on opencv image

#ifdef NCNN_PROFILING
        double t_draw_end = ncnn::get_current_time();
        fprintf(stdout, "NCNN OpenCV draw result time %.02lfms\n", t_draw_end - t_draw_start);
#endif

        if (!is_streaming)
        {   //If it is a still image, exit!
            return 0;
        }
    }

    return 0;
}